

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void compact_vector_suite::test_uint64_empty(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined2 local_e2;
  undefined1 local_e0 [6];
  output_type expected [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0);
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0);
  local_e2 = 0xae;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x24c,"void compact_vector_suite::test_uint64_empty()",iVar1._M_current,
             iVar2._M_current,&local_e2,local_e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_uint64_empty()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::vector<std::uint64_t> value;
    ar << value;

    output_type expected[] = { token::code::array8_int64, 0x00 };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}